

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

bool __thiscall
dg::GenericCallGraph<const_llvm::Function_*>::FuncNode::addCall(FuncNode *this,FuncNode *x)

{
  bool bVar1;
  bool bVar2;
  FuncNode *local_28;
  FuncNode *local_20;
  
  local_28 = x;
  bVar1 = calls(this,x);
  if (!bVar1) {
    std::
    vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
    ::push_back(&this->_calls,&local_28);
    bVar2 = isCalledBy(local_28,this);
    if (!bVar2) {
      local_20 = this;
      std::
      vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>
      ::emplace_back<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>
                ((vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>
                  *)&local_28->_callers,&local_20);
    }
  }
  return !bVar1;
}

Assistant:

bool addCall(FuncNode *x) {
            if (calls(x))
                return false;
            _calls.push_back(x);
            if (!x->isCalledBy(this))
                x->_callers.push_back(this);
            return true;
        }